

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blif_parser.cpp
# Opt level: O0

void __thiscall Blif::pushAllNodes(Blif *this,string *s)

{
  bool bVar1;
  string local_130;
  Node local_110;
  __normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_> local_68 [3];
  string local_50 [32];
  __normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_> local_30;
  __normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_> local_28;
  __normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_> local_20;
  string *local_18;
  string *s_local;
  Blif *this_local;
  
  local_18 = s;
  s_local = &this->_model;
  local_28._M_current = (Node *)std::begin<std::vector<Node,std::allocator<Node>>>(&this->_allNodes)
  ;
  local_30._M_current = (Node *)std::end<std::vector<Node,std::allocator<Node>>>(&this->_allNodes);
  std::__cxx11::string::string(local_50,(string *)s);
  local_20 = std::
             find_if<__gnu_cxx::__normal_iterator<Node*,std::vector<Node,std::allocator<Node>>>,Blif::pushAllNodes(std::__cxx11::string)::_lambda(Node&)_1_>
                       (local_28,local_30,(anon_class_32_1_54a39813_for__M_pred *)local_50);
  local_68[0]._M_current =
       (Node *)std::end<std::vector<Node,std::allocator<Node>>>(&this->_allNodes);
  bVar1 = __gnu_cxx::operator==(&local_20,local_68);
  pushAllNodes(std::__cxx11::string)::{lambda(Node&)#1}::~Node((_lambda_Node___1_ *)local_50);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_130,(string *)s);
    Node::Node(&local_110,&local_130,false);
    std::vector<Node,_std::allocator<Node>_>::push_back(&this->_allNodes,&local_110);
    Node::~Node(&local_110);
    std::__cxx11::string::~string((string *)&local_130);
  }
  return;
}

Assistant:

void pushAllNodes(string s) {
    if (find_if(begin(this->_allNodes), end(this->_allNodes), [=] (Node& n) { return n.node() == s; }) == end(this->_allNodes)) {
      this->_allNodes.push_back(Node(s, false)); // all nodes stores only relation information, negate can be ignored
    }
  }